

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::PathTypeHandlerBase::FreezeImpl
          (PathTypeHandlerBase *this,DynamicObject *instance,bool isConvertedType)

{
  int *piVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  DynamicType *pDVar2;
  DynamicType *this_00;
  DynamicTypeHandler *this_01;
  ScriptContext *scriptContext;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  BOOL BVar6;
  undefined4 extraout_var;
  DictionaryTypeHandlerBase<unsigned_short> *pDVar7;
  undefined4 *puVar8;
  undefined4 extraout_var_00;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true> *pSVar9;
  RecyclerWeakReference<Js::DynamicType> *typeWeakRef;
  DynamicType *newType;
  RecyclerWeakReference<Js::DynamicType> *local_50;
  RecyclerWeakReference<Js::DynamicType> *newTypeWeakRef;
  DynamicType *local_40;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true> *local_38;
  
  piVar1 = &((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr)->convertPathToDictionaryExtensionsCount
  ;
  *piVar1 = *piVar1 + 1;
  bVar4 = DynamicObject::HasObjectArray(instance);
  if (!bVar4) {
    iVar5 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6f])(this);
    if (CONCAT44(extraout_var,iVar5) == 0) {
      local_50 = (RecyclerWeakReference<Js::DynamicType> *)0x0;
      pDVar2 = (DynamicType *)(instance->super_RecyclableObject).type.ptr;
      PathTypeSuccessorKey::PathTypeSuccessorKey
                ((PathTypeSuccessorKey *)&newTypeWeakRef,InternalPropertyRecords::FrozenType._8_4_,
                 ObjectSlotAttr_Default);
      bVar4 = GetSuccessor(this,(PathTypeSuccessorKey)newTypeWeakRef,&local_50);
      if ((bVar4) &&
         (this_00 = (DynamicType *)(local_50->super_RecyclerWeakReferenceBase).strongRef,
         this_00 != (DynamicType *)0x0)) {
        this_01 = (this_00->typeHandler).ptr;
        DynamicType::ShareType(this_00);
        DynamicTypeHandler::SetFlags(this_01,(this->super_DynamicTypeHandler).flags & 0x20);
        iVar5 = (*this_01->_vptr_DynamicTypeHandler[0x59])(this_01);
        if ((char)iVar5 != '\0') {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar8 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                      ,0x577,"(!newTypeHandler->HasSingletonInstance())",
                                      "!newTypeHandler->HasSingletonInstance()");
          if (!bVar4) {
LAB_00c4af66:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar8 = 0;
        }
        bVar4 = DynamicObject::IsObjectHeaderInlinedTypeHandler(instance);
        if (bVar4) {
          DynamicTypeHandler::AdjustSlots
                    (instance,this_01->inlineSlotCapacity,
                     this_01->slotCapacity - (uint)this_01->inlineSlotCapacity);
        }
        DynamicTypeHandler::ReplaceInstanceType(instance,this_00);
        BVar6 = 1;
      }
      else {
        iVar5 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6f])(this);
        if (CONCAT44(extraout_var_00,iVar5) != 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar8 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                      ,0x55a,"(CanConvertToSimpleDictionaryType())",
                                      "CanConvertToSimpleDictionaryType()");
          if (!bVar4) goto LAB_00c4af66;
          *puVar8 = 0;
        }
        local_40 = pDVar2;
        pSVar9 = ConvertToSimpleDictionaryType<Js::SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true>>
                           (this,instance,(uint)((this->super_DynamicTypeHandler).unusedBytes >> 1),
                            true);
        if (((pSVar9->super_DynamicTypeHandler).flags & 0x18) != 8) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar8 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                      ,0x560,
                                      "(newTypeHandler->GetMayBecomeShared() && !newTypeHandler->GetIsShared())"
                                      ,
                                      "newTypeHandler->GetMayBecomeShared() && !newTypeHandler->GetIsShared()"
                                     );
          if (!bVar4) goto LAB_00c4af66;
          *puVar8 = 0;
        }
        pDVar2 = (DynamicType *)(instance->super_RecyclableObject).type.ptr;
        local_38 = pSVar9;
        DynamicType::LockType(pDVar2);
        if (pDVar2->isShared == true) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar8 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                      ,0x563,"(!newType->GetIsShared())","!newType->GetIsShared()");
          if (!bVar4) goto LAB_00c4af66;
          *puVar8 = 0;
        }
        scriptContext =
             (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr;
        typeWeakRef = Memory::Recycler::CreateWeakReferenceHandle<Js::DynamicType>
                                (scriptContext->recycler,pDVar2);
        SetSuccessor(this,local_40,(PathTypeSuccessorKey)newTypeWeakRef,typeWeakRef,scriptContext);
        BVar6 = SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>::
                FreezeInternal(local_38,instance,true);
      }
      return BVar6;
    }
  }
  pDVar7 = ConvertToTypeHandler<Js::DictionaryTypeHandlerBase<unsigned_short>>(this,instance);
  UNRECOVERED_JUMPTABLE = (pDVar7->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[99];
  iVar5 = (*UNRECOVERED_JUMPTABLE)(pDVar7,instance,(ulong)isConvertedType,UNRECOVERED_JUMPTABLE);
  return iVar5;
}

Assistant:

BOOL PathTypeHandlerBase::FreezeImpl(DynamicObject* instance, bool isConvertedType)
    {
#ifdef PROFILE_TYPES
        instance->GetScriptContext()->convertPathToDictionaryExtensionsCount++;
#endif
        // See the comment inside Seal WRT HasObjectArray branch.
        if (instance->HasObjectArray() || !this->CanConvertToSimpleDictionaryType())
        {
            return this->ConvertToDictionaryType(instance)->Freeze(instance, isConvertedType);
        }
        else
        {
            return this->ConvertToSharedNonExtensibleTypeIfNeededAndCallOperation(instance, InternalPropertyRecords::FrozenType,
                [&](SimpleDictionaryTypeHandlerWithNonExtensibleSupport* newTypeHandler)
                {
                    return newTypeHandler->FreezeInternal(instance, true);  // true: we don't want to change type in FreezeInternal.
                });
        }
    }